

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

int json_array_clear(json_t *json)

{
  json_t *json_00;
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  iVar1 = -1;
  if ((json != (json_t *)0x0) && (iVar1 = -1, json->type == JSON_ARRAY)) {
    uVar2 = json[1].refcount;
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        json_00 = *(json_t **)(*(long *)(json + 2) + uVar4 * 8);
        if (((json_00 != (json_t *)0x0) && (json_00->refcount != 0xffffffffffffffff)) &&
           (sVar3 = json_00->refcount - 1, json_00->refcount = sVar3, sVar3 == 0)) {
          json_delete(json_00);
          uVar2 = json[1].refcount;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar2);
    }
    json[1].refcount = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int json_array_clear(json_t *json)
{
	json_array_t *array;
	size_t i;

	if (!json_is_array(json))
		return -1;
	array = json_to_array(json);

	for (i = 0; i < array->entries; i++)
		json_decref(array->table[i]);

	array->entries = 0;
	return 0;
}